

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O3

void __thiscall CircBufTest::test1(CircBufTest *this,CircularBuffer *tbuff)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  void *__s1;
  int k;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int size;
  int tmpsz;
  CircularBuffer hugeBuf;
  uint8_t buf [254];
  CircularBuffer tinyBuf;
  uint8_t dumpBuf [254];
  int local_404;
  int local_400;
  CircularBuffer local_3f8 [224];
  char local_318 [256];
  CircularBuffer local_218 [224];
  undefined1 local_138 [264];
  long lVar11;
  
  JetHead::CircularBuffer::CircularBuffer((CircularBuffer *)(local_318 + 0x100),1);
  JetHead::CircularBuffer::CircularBuffer(local_3f8,0xfe);
  if (tbuff != (CircularBuffer *)0x0) {
    memcpy(local_3f8,tbuff,0xd9);
  }
  lVar6 = 0;
  auVar10 = _DAT_00108040;
  auVar12 = _DAT_00108050;
  auVar13 = _DAT_00108060;
  auVar14 = _DAT_00108070;
  auVar15 = _DAT_00108080;
  auVar16 = _DAT_00108090;
  auVar17 = _DAT_001080a0;
  auVar18 = _DAT_001080b0;
  do {
    auVar19 = auVar18 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar28._4_4_ = iVar2;
    auVar28._0_4_ = iVar2;
    auVar28._8_4_ = iVar3;
    auVar28._12_4_ = iVar3;
    auVar36._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar36._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar36._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar36._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar20._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar36;
    auVar19 = pshuflw(auVar28,auVar20,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    cVar1 = (char)lVar6;
    if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_318[lVar6] = cVar1;
    }
    auVar19 = packssdw(auVar20,auVar20);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._0_4_ >> 8 & 1) != 0) {
      local_318[lVar6 + 1] = cVar1 + '\x01';
    }
    auVar19 = auVar17 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar29._4_4_ = iVar2;
    auVar29._0_4_ = iVar2;
    auVar29._8_4_ = iVar3;
    auVar29._12_4_ = iVar3;
    auVar37._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar37._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar37._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar37._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar21._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar37;
    auVar19 = packssdw(auVar29,auVar21);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._0_4_ >> 0x10 & 1) != 0) {
      local_318[lVar6 + 2] = cVar1 + '\x02';
    }
    auVar19 = pshufhw(auVar21,auVar21,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._0_4_ >> 0x18 & 1) != 0) {
      local_318[lVar6 + 3] = cVar1 + '\x03';
    }
    auVar19 = auVar16 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar30._4_4_ = iVar2;
    auVar30._0_4_ = iVar2;
    auVar30._8_4_ = iVar3;
    auVar30._12_4_ = iVar3;
    auVar38._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar38._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar38._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar38._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar22._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar38;
    auVar19 = pshuflw(auVar30,auVar22,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_318[lVar6 + 4] = cVar1 + '\x04';
    }
    auVar19 = packssdw(auVar22,auVar22);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._4_2_ >> 8 & 1) != 0) {
      local_318[lVar6 + 5] = cVar1 + '\x05';
    }
    auVar19 = auVar15 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar31._4_4_ = iVar2;
    auVar31._0_4_ = iVar2;
    auVar31._8_4_ = iVar3;
    auVar31._12_4_ = iVar3;
    auVar39._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar39._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar39._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar39._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar23._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar39;
    auVar19 = packssdw(auVar31,auVar23);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_318[lVar6 + 6] = cVar1 + '\x06';
    }
    auVar19 = pshufhw(auVar23,auVar23,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._6_2_ >> 8 & 1) != 0) {
      local_318[lVar6 + 7] = cVar1 + '\a';
    }
    auVar19 = auVar14 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar32._4_4_ = iVar2;
    auVar32._0_4_ = iVar2;
    auVar32._8_4_ = iVar3;
    auVar32._12_4_ = iVar3;
    auVar40._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar40._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar40._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar40._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar24._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar40;
    auVar19 = pshuflw(auVar32,auVar24,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_318[lVar6 + 8] = cVar1 + '\b';
    }
    auVar19 = packssdw(auVar24,auVar24);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._8_2_ >> 8 & 1) != 0) {
      local_318[lVar6 + 9] = cVar1 + '\t';
    }
    auVar19 = auVar13 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar33._4_4_ = iVar2;
    auVar33._0_4_ = iVar2;
    auVar33._8_4_ = iVar3;
    auVar33._12_4_ = iVar3;
    auVar41._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar41._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar41._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar41._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar25._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar41;
    auVar19 = packssdw(auVar33,auVar25);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_318[lVar6 + 10] = cVar1 + '\n';
    }
    auVar19 = pshufhw(auVar25,auVar25,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._10_2_ >> 8 & 1) != 0) {
      local_318[lVar6 + 0xb] = cVar1 + '\v';
    }
    auVar19 = auVar12 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar34._4_4_ = iVar2;
    auVar34._0_4_ = iVar2;
    auVar34._8_4_ = iVar3;
    auVar34._12_4_ = iVar3;
    auVar42._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar42._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar42._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar42._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar26._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar42;
    auVar19 = pshuflw(auVar34,auVar26,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_318[lVar6 + 0xc] = cVar1 + '\f';
    }
    auVar19 = packssdw(auVar26,auVar26);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._12_2_ >> 8 & 1) != 0) {
      local_318[lVar6 + 0xd] = cVar1 + '\r';
    }
    auVar19 = auVar10 ^ _DAT_001080d0;
    iVar2 = auVar19._0_4_;
    iVar3 = auVar19._8_4_;
    auVar35._4_4_ = iVar2;
    auVar35._0_4_ = iVar2;
    auVar35._8_4_ = iVar3;
    auVar35._12_4_ = iVar3;
    auVar43._0_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar43._4_4_ = -(uint)(iVar2 < -0x7fffff02);
    auVar43._8_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar43._12_4_ = -(uint)(iVar3 < -0x7fffff02);
    auVar27._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar43;
    auVar19 = packssdw(auVar35,auVar27);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_318[lVar6 + 0xe] = cVar1 + '\x0e';
    }
    auVar19 = pshufhw(auVar27,auVar27,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._14_2_ >> 8 & 1) != 0) {
      local_318[lVar6 + 0xf] = cVar1 + '\x0f';
    }
    lVar6 = lVar6 + 0x10;
    lVar11 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 0x10;
    auVar18._8_8_ = lVar11 + 0x10;
    lVar11 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 0x10;
    auVar17._8_8_ = lVar11 + 0x10;
    lVar11 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 0x10;
    auVar16._8_8_ = lVar11 + 0x10;
    lVar11 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 0x10;
    auVar15._8_8_ = lVar11 + 0x10;
    lVar11 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 0x10;
    auVar14._8_8_ = lVar11 + 0x10;
    lVar11 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 0x10;
    auVar13._8_8_ = lVar11 + 0x10;
    lVar11 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 0x10;
    auVar12._8_8_ = lVar11 + 0x10;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 0x10;
    auVar10._8_8_ = lVar11 + 0x10;
  } while (lVar6 != 0x100);
  iVar2 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar2 != 1) && (iVar2 = JetHead::CircularBuffer::getSize(), iVar2 != 1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xbf,"getFreeSpace or getSize failure.");
  }
  iVar2 = JetHead::CircularBuffer::getLength();
  if (iVar2 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xc2,"getLength failure.");
  }
  JetHead::CircularBuffer::writeByte((uchar)local_318);
  iVar2 = JetHead::CircularBuffer::getLength();
  if (((iVar2 != 1) && (iVar2 = JetHead::CircularBuffer::getSize(), iVar2 != 1)) &&
     (iVar2 = JetHead::CircularBuffer::getFreeSpace(), iVar2 != 0)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,200,"update of buffer length after writeByte failed");
  }
  JetHead::CircularBuffer::clear();
  iVar2 = JetHead::CircularBuffer::getLength();
  if (((iVar2 != 0) && (iVar2 = JetHead::CircularBuffer::getSize(), iVar2 != 1)) &&
     (iVar2 = JetHead::CircularBuffer::getFreeSpace(), iVar2 != 1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xce,"update of buffer length after clear failed");
  }
  JetHead::CircularBuffer::write((uchar *)local_3f8,(int)local_318);
  iVar2 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar2 != 0x7f) && (iVar2 = JetHead::CircularBuffer::getLength(), iVar2 != 0x7f)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xd7,"update of buffer length after write failed");
  }
  JetHead::CircularBuffer::read((uchar *)local_3f8,(int)local_138);
  iVar2 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar2 != 0xfe) && (iVar2 = JetHead::CircularBuffer::getLength(), iVar2 != 0)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xdf,"update of buffer length after read failed");
  }
  JetHead::CircularBuffer::write((uchar *)local_3f8,(int)local_318);
  iVar2 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar2 != 0x7f) && (iVar2 = JetHead::CircularBuffer::getLength(), iVar2 != 0x7f)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xe9,"update of buffer length after write failed");
  }
  iVar2 = JetHead::CircularBuffer::byteAt((int)local_3f8);
  if (iVar2 != -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xef,"byteAt failed");
  }
  JetHead::CircularBuffer::getBytes((int)local_3f8,(int *)0x0);
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
             ,0xf6,"getBytes failed");
  JetHead::CircularBuffer::clear();
  iVar2 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar2 != 0xfe) && (iVar2 = JetHead::CircularBuffer::getLength(), iVar2 != 0)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xfe,"update of buffer length after clear failed");
  }
  iVar2 = 1;
  do {
    if ((byte)((byte)((char)iVar2 * -0x55) >> 3 | (char)iVar2 * '`') < 0xb) {
      JetHead::CircularBuffer::clear();
      iVar3 = JetHead::CircularBuffer::getSize();
      if (((iVar3 != 0xfe) && (iVar3 = JetHead::CircularBuffer::getFreeSpace(), iVar3 != 0xfe)) &&
         (iVar3 = JetHead::CircularBuffer::getLength(), iVar3 != 0)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x114,"getLength, getSize, or getFreeSpace failed after a clear.");
      }
    }
    rand();
    JetHead::CircularBuffer::write((uchar *)local_3f8,(int)local_318);
    JetHead::CircularBuffer::read((uchar *)local_3f8,(int)local_138);
    local_404 = 1;
    uVar7 = 0;
    do {
      iVar3 = JetHead::CircularBuffer::getSize();
      if (((iVar3 != 0xfe) && (iVar3 = JetHead::CircularBuffer::getFreeSpace(), iVar3 != 0xfe)) &&
         (iVar3 = JetHead::CircularBuffer::getLength(), iVar3 != 0)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x124,"getLength, getSize, or getFreeSpace failure.");
      }
      if (uVar7 != 0) {
        uVar9 = 0;
        do {
          JetHead::CircularBuffer::writeByte((uchar)local_3f8);
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      iVar3 = JetHead::CircularBuffer::getSize();
      if (((iVar3 != 0xfe) &&
          (iVar3 = JetHead::CircularBuffer::getFreeSpace(), 0xfe - (int)uVar7 != iVar3)) &&
         (uVar4 = JetHead::CircularBuffer::getLength(), uVar7 != uVar4)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,300,"getLength, getSize, or getFreeSpace failure.");
      }
      iVar3 = local_404;
      if (uVar7 != 0) {
        do {
          iVar8 = (int)local_3f8;
          iVar5 = JetHead::CircularBuffer::byteAt(iVar8);
          if (iVar3 + -2 != iVar5) {
            TestCase::TestFailedInternal
                      (&this->super_TestCase,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                       ,0x131,"writeByte or byteAt failed");
          }
          iVar3 = iVar3 + -1;
        } while (1 < iVar3);
        if (uVar7 != 0) {
          uVar9 = 0;
          do {
            __s1 = (void *)JetHead::CircularBuffer::getBytes(iVar8,(int *)(uVar9 & 0xffffffff));
            iVar3 = bcmp(__s1,local_318 + uVar9,(long)local_400);
            if (iVar3 != 0) {
              TestCase::TestFailedInternal
                        (&this->super_TestCase,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                         ,0x138,"getBytes failed");
            }
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      JetHead::CircularBuffer::getLength();
      JetHead::CircularBuffer::read((uchar *)local_3f8,(int)local_138);
      uVar7 = uVar7 + 1;
      local_404 = local_404 + 1;
    } while (uVar7 != 0xfe);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xfe);
  JetHead::CircularBuffer::~CircularBuffer(local_3f8);
  JetHead::CircularBuffer::~CircularBuffer((CircularBuffer *)(local_318 + 0x100));
  return;
}

Assistant:

void CircBufTest::test1(CircularBuffer* tbuff)
{
	CircularBuffer tinyBuf = CircularBuffer(1);
	// uint8_t tmpbuf[HUGE_BUF_SIZE];
	//CircularBuffer hugeBuf = CircularBuffer(tmpbuf,HUGE_BUF_SIZE);
	CircularBuffer hugeBuf = CircularBuffer(HUGE_BUF_SIZE);


	if(tbuff != NULL)
		hugeBuf = *tbuff;

	uint8_t buf[HUGE_BUF_SIZE];
	uint8_t dumpBuf[HUGE_BUF_SIZE];

	iota(buf, buf + HUGE_BUF_SIZE , (uint8_t) 0);


	// Checking getFreeSpace, getSize, getLength on a buffer of size 1.
	if (tinyBuf.getFreeSpace() != 1 && tinyBuf.getSize() != 1)
		TestFailed("getFreeSpace or getSize failure.");

	if (tinyBuf.getLength() != 0)
		TestFailed("getLength failure.");

	tinyBuf.writeByte(0);

	// Test that after writing a byte free space and length are updated correctly
	if (tinyBuf.getLength() != 1 && tinyBuf.getSize() != 1 && tinyBuf.getFreeSpace() != 0)
		TestFailed("update of buffer length after writeByte failed");

	tinyBuf.clear();

	// Test that after calling claer free space and length are updated correctly
	if (tinyBuf.getLength() != 0 &&  tinyBuf.getSize() != 1 && tinyBuf.getFreeSpace() != 1)
		TestFailed("update of buffer length after clear failed");


	// Test individual write
	hugeBuf.write(buf, HUGE_BUF_SIZE / 2);
	
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE / 2
		and hugeBuf.getLength() != HUGE_BUF_SIZE / 2)
	{
		TestFailed("update of buffer length after write failed");
	}
	
	// Test that a read can undo the write
	hugeBuf.read(dumpBuf, HUGE_BUF_SIZE);
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE
		and hugeBuf.getLength() != 0)
	{
		TestFailed("update of buffer length after read failed");
	}
	
	
	// Test individual write again
	hugeBuf.write(buf, HUGE_BUF_SIZE / 2);
	
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE / 2
		and hugeBuf.getLength() != HUGE_BUF_SIZE / 2)
	{
		TestFailed("update of buffer length after write failed");
	}
	
	int tmp = hugeBuf.byteAt(HUGE_BUF_SIZE / 2);
	if (tmp != -1)
	{
		TestFailed("byteAt failed");
	}
	
	int tmpsz = HUGE_BUF_SIZE;
	const uint8_t *tmpptr = hugeBuf.getBytes(0, tmpsz);
	if (tmpsz != HUGE_BUF_SIZE / 2)
	{
		TestFailed("getBytes failed");
	}
	tmpptr = NULL;
	
	hugeBuf.clear();
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE
		and hugeBuf.getLength() != 0)
	{
		TestFailed("update of buffer length after clear failed");
	}
	
	// More testing of getSize, getFreeSpace, getLength, but with a large buffer.
	// Also testing byte interface.

	// This code is semi-randomized, it initally fills a bit of the buffer and
	// empties it, with the goal to get the buffer out of its initial state.

	// Then in each iteration it adds some amount
	// (starting small and becoming large) of bytes to the buffer,
	//  and takes them out.
	for (int j = 1; j < HUGE_BUF_SIZE; j++)
	{
		// Warning: If clear could screw up something below, but I doubt it.
		if( j % 24 == 0)
		{
			hugeBuf.clear();

			if( hugeBuf.getSize() != HUGE_BUF_SIZE &&
					hugeBuf.getFreeSpace() != HUGE_BUF_SIZE &&
					hugeBuf.getLength() != 0)
				TestFailed("getLength, getSize, or getFreeSpace failed after a clear.");
		}
		int offset = rand() % j;

		// Just want to advance starting position.
		hugeBuf.write(buf, offset );
		hugeBuf.read(dumpBuf, offset);



		for( int k = 0; k < HUGE_BUF_SIZE; k++)
		{

			if( hugeBuf.getSize() != HUGE_BUF_SIZE &&
					hugeBuf.getFreeSpace() != HUGE_BUF_SIZE &&
					hugeBuf.getLength() != 0)
				TestFailed("getLength, getSize, or getFreeSpace failure.");

			for( int i = 0; i < k; i++)
				hugeBuf.writeByte((uint8_t)i);

			if( hugeBuf.getSize() != HUGE_BUF_SIZE &&
					hugeBuf.getFreeSpace() != HUGE_BUF_SIZE - k &&
					hugeBuf.getLength() != k)
				TestFailed("getLength, getSize, or getFreeSpace failure.");

			// Do it backwards for fun.
			for(int i = k - 1; i > -1; i--)
				if( hugeBuf.byteAt(i) != i)
					TestFailed("writeByte or byteAt failed");

			int size;
			for( int i = 0; i < k; i++)
			{
				const uint8_t *loc = hugeBuf.getBytes(i , size);
				if ( memcmp(loc, buf + i, size) )
					TestFailed("getBytes failed");
			}

			// byteAt doesn't take things out of the buffer, so do it manually.
			hugeBuf.read(dumpBuf,hugeBuf.getLength());
		}
	}
}